

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_avx512vbmi_harley_seal(uint8_t *data,size_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint32_t pospopcnt16 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  pospopcnt_u16_avx512vbmi_harley_seal((uint16_t *)data,(uint32_t)(len >> 1),(uint32_t *)&local_68);
  auVar2._8_8_ = uStack_40;
  auVar2._0_8_ = uStack_48;
  auVar2._16_8_ = uStack_38;
  auVar2._24_8_ = uStack_30;
  auVar3._8_8_ = uStack_60;
  auVar3._0_8_ = local_68;
  auVar3._16_8_ = uStack_58;
  auVar3._24_8_ = uStack_50;
  auVar3 = vpaddd_avx2(auVar2,auVar3);
  *(undefined1 (*) [32])flags = auVar3;
  if ((len & 1) != 0) {
    auVar3 = vpbroadcastd_avx512vl();
    auVar3 = vpsrlvd_avx2(auVar3,_DAT_00119140);
    auVar1._8_4_ = 1;
    auVar1._0_8_ = 0x100000001;
    auVar1._12_4_ = 1;
    auVar1._16_4_ = 1;
    auVar1._20_4_ = 1;
    auVar1._24_4_ = 1;
    auVar1._28_4_ = 1;
    auVar3 = vpandd_avx512vl(auVar3,auVar1);
    auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])flags);
    *(undefined1 (*) [32])flags = auVar3;
  }
  return;
}

Assistant:

pospopcnt_u16_stub(pospopcnt_u16_avx512vbmi_harley_seal)
pospopcnt_u8_stub(pospopcnt_u8_avx512vbmi_harley_seal)
#endif

int pospopcnt_u16_avx512_masked_ops(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i counter = _mm512_setzero_si512();
    __m512i ones = _mm512_set1_epi32(1);

    for (uint32_t i = 0; i < len; ++i) {
        counter = _mm512_mask_add_epi32(counter, data[i], counter, ones);
    }

    _mm512_storeu_si512((__m512i*)flags, counter);
    return 0;
}